

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  ulonglong uVar8;
  int __oflag;
  char *pcVar9;
  char *pcVar10;
  char *__format;
  int iVar11;
  long lVar12;
  char *local_f8;
  PARAMETERS params;
  tlc_linecount_t count;
  tlc_string_t errstr;
  CLineCount lc;
  
  params.buffersize = 0xffffffffffffffff;
  params.threadcount = -1;
  if (argc == 1) {
LAB_00103777:
    help(*argv);
LAB_00103786:
    exit(0);
  }
  local_f8 = (char *)0x0;
  bVar3 = false;
  for (iVar11 = 1; iVar11 < argc; iVar11 = iVar11 + 1) {
    pcVar9 = argv[iVar11];
    cVar1 = *pcVar9;
    if ((((cVar1 == '-') && (pcVar9[1] == 'h')) && (pcVar9[2] == '\0')) ||
       (iVar4 = strcmp(pcVar9,"--help"), iVar4 == 0)) goto LAB_00103777;
    if ((((cVar1 == '-') && (pcVar9[1] == 'v')) && (pcVar9[2] == '\0')) ||
       (iVar4 = strcmp(pcVar9,"--version"), iVar4 == 0)) {
      version();
      goto LAB_00103786;
    }
    bVar2 = bVar3;
    if ((((cVar1 == '-') && (pcVar9[1] == 'b')) && (pcVar9[2] == '\0')) ||
       (iVar4 = strcmp(pcVar9,"--buffersize"), iVar4 == 0)) {
      iVar11 = iVar11 + 1;
      if (iVar11 == argc) {
        pcVar10 = *argv;
        __format = "%s: missing argument to %s\n";
LAB_00103748:
        fprintf(_stderr,__format,pcVar10,pcVar9);
        return 1;
      }
      pcVar9 = argv[iVar11];
      sVar6 = strlen(pcVar9);
      uVar7 = (ulong)((byte)pcVar9[sVar6 - 1] - 0x47);
      if ((byte)pcVar9[sVar6 - 1] - 0x47 < 0x27) {
        if ((0x100000001U >> (uVar7 & 0x3f) & 1) == 0) {
          lVar12 = 0x400;
          if ((0x1000000010U >> (uVar7 & 0x3f) & 1) == 0) {
            if ((0x4000000040U >> (uVar7 & 0x3f) & 1) == 0) goto LAB_001035d2;
            lVar12 = 0x100000;
          }
        }
        else {
          lVar12 = 0x40000000;
        }
      }
      else {
LAB_001035d2:
        lVar12 = 1;
      }
      uVar8 = strtoull(pcVar9,(char **)&lc,10);
      params.buffersize = uVar8 * lVar12;
    }
    else if ((((cVar1 == '-') && (pcVar9[1] == 't')) && (pcVar9[2] == '\0')) ||
            (iVar4 = strcmp(pcVar9,"--threadcount"), iVar4 == 0)) {
      iVar11 = iVar11 + 1;
      if (iVar11 == argc) {
        pcVar10 = *argv;
        __format = "%s: Missing argument to %s\n";
        goto LAB_00103748;
      }
      params.threadcount = atoi(argv[iVar11]);
      if (params.threadcount < 1) {
        pcVar9 = *argv;
        pcVar10 = "%s: Invalid thread count\n";
        goto LAB_00103768;
      }
    }
    else {
      local_f8 = pcVar9;
      bVar2 = true;
      if (bVar3) {
        pcVar9 = *argv;
        pcVar10 = "%s: Too many arguments\n";
        goto LAB_00103768;
      }
    }
    bVar3 = bVar2;
  }
  if (!bVar3) {
    pcVar9 = *argv;
    pcVar10 = "%s: Missing required argument\n";
LAB_00103768:
    fprintf(_stderr,pcVar10,pcVar9);
    return 1;
  }
  TURBOLINECOUNT::CLineCount::CLineCount(&lc,&params);
  iVar11 = TURBOLINECOUNT::CLineCount::open(&lc,local_f8,__oflag);
  if ((char)iVar11 == '\0') {
    uVar5 = TURBOLINECOUNT::CLineCount::lastError(&lc);
    TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_(&errstr,&lc);
    pcVar9 = *argv;
    pcVar10 = "%s: Error %d (%s)\n";
  }
  else {
    bVar3 = TURBOLINECOUNT::CLineCount::countLines(&lc,&count);
    if (bVar3) {
      uVar5 = 0;
      printf("%ld\n",count);
      goto LAB_0010364b;
    }
    uVar5 = TURBOLINECOUNT::CLineCount::lastError(&lc);
    TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_(&errstr,&lc);
    pcVar9 = *argv;
    pcVar10 = "%s: Error %d: (%s)\n";
  }
  fprintf(_stderr,pcVar10,pcVar9,(ulong)uVar5,errstr._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&errstr);
LAB_0010364b:
  TURBOLINECOUNT::CLineCount::~CLineCount(&lc);
  return uVar5;
}

Assistant:

int main(int argc, char **argv)
#endif
{
	// Parse parameters
	int arg = 1;
	int posparam = 0;
	
	CLineCount::PARAMETERS params;
	params.buffersize = -1;
	params.threadcount = -1;

	TCHAR *filename = NULL;

	if(argc==1)
	{
		help(argv[0]);
		exit(0);
	}

	while (arg < argc)
	{
		if (_tcscmp(argv[arg], _T("-h")) == 0 || _tcscmp(argv[arg], _T("--help")) == 0) 
		{
			help(argv[0]);
			exit(0);
		}
		else if (_tcscmp(argv[arg], _T("-v")) == 0 || _tcscmp(argv[arg], _T("--version")) == 0) 
		{
			version();
			exit(0);
		}
		else if (_tcscmp(argv[arg], _T("-b")) == 0 || _tcscmp(argv[arg], _T("--buffersize")) == 0)
		{
			arg++;
			if (arg == argc)
			{
				_ftprintf(stderr, _T("%s: missing argument to %s\n"), argv[0], argv[arg-1]);
				return 1;
			}

			TCHAR *wsstr = argv[arg];

			// Check for size multipliers			
			size_t multiplier = 1;
			TCHAR *lastchar = wsstr + (_tcslen(wsstr) - 1);
			if (*lastchar == _T('k') || *lastchar == _T('K'))
			{
				multiplier = 1024;
				lastchar = 0;
			}
			else if (*lastchar == _T('m') || *lastchar == _T('M'))
			{
				multiplier = 1024 * 1024;
				lastchar = 0;
			}
			else if (*lastchar == _T('g') || *lastchar == _T('G'))
			{
				multiplier = 1024 * 1024 * 1024;
				lastchar = 0;
			}

			TCHAR *endptr;
			params.buffersize = ((size_t)_tcstoui64(argv[arg], &endptr, 10)) * multiplier;

		}
		else if (_tcscmp(argv[arg], _T("-t")) == 0 || _tcscmp(argv[arg], _T("--threadcount")) == 0)
		{
			arg++;
			if (arg == argc)
			{
				_ftprintf(stderr, _T("%s: Missing argument to %s\n"), argv[0], argv[arg-1]);
				return 1;
			}

			params.threadcount = _ttoi(argv[arg]);
			if(params.threadcount<=0)
			{
				_ftprintf(stderr, _T("%s: Invalid thread count\n"), argv[0]);
				return 1;
			}
		}
		else
		{
			if (posparam == 0)
			{
				filename = argv[arg];
			}
			else
			{
				_ftprintf(stderr, _T("%s: Too many arguments\n"), argv[0]);
				return 1;
			}
			posparam++;
		}

		arg++;
	}

	if (posparam != 1)
	{
		_ftprintf(stderr, _T("%s: Missing required argument\n"), argv[0]);
		return 1;
	}
	
	// Create line count class
	CLineCount lc(&params);

	if (!lc.open(filename))
	{
		tlc_error_t err = lc.lastError();
		tlc_string_t errstr = lc.lastErrorString();

		_ftprintf(stderr, _T("%s: Error %d (%s)\n"), argv[0], err, errstr.c_str());
		return err;
	}

	// Count lines
	tlc_linecount_t count;
	if (!lc.countLines(count))
	{
		tlc_error_t err = lc.lastError();
		tlc_string_t errstr = lc.lastErrorString();

		_ftprintf(stderr, _T("%s: Error %d: (%s)\n"), argv[0], err, errstr.c_str());
		return err;
	}

	// Display output
	_tprintf(_T(TLC_LINECOUNT_FMT) _T("\n"), count);
	
	return 0;
}